

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_reader.cc
# Opt level: O0

property_type * __thiscall
properties_actor<properties_actor_traits>::allocate_abi_cxx11_
          (properties_actor<properties_actor_traits> *this)

{
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *this_00;
  reference __uref;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  properties_actor<properties_actor_traits> *local_10;
  properties_actor<properties_actor_traits> *this_local;
  
  this->current_reference = (current_reference_callback)get_abi_cxx11_;
  *(undefined8 *)&this->field_0x58 = 0;
  this_00 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
             *)this->properties;
  local_10 = this;
  std::__cxx11::string::string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string,std::__cxx11::string>(this_00,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  __uref = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::back(this->properties);
  std::reference_wrapper<std::pair<std::__cxx11::string,std::__cxx11::string>>::
  reference_wrapper<std::pair<std::__cxx11::string,std::__cxx11::string>&,void,std::pair<std::__cxx11::string,std::__cxx11::string>*>
            ((reference_wrapper<std::pair<std::__cxx11::string,std::__cxx11::string>> *)local_68,
             __uref);
  (this->property)._M_data = local_68[0];
  ppVar1 = std::reference_wrapper::operator_cast_to_pair_((reference_wrapper *)&this->property);
  return ppVar1;
}

Assistant:

property_type & allocate() {
            current_reference = &properties_actor::get;
            properties.emplace_back(std::string(), std::string());
            property = properties.back();
            return property;
        }